

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void DeduceShortFunctionReturnValue
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               IntrusiveList<ExprBase> *expressions)

{
  TypeBase *pTVar1;
  bool bVar2;
  TypeFunction *pTVar3;
  ExprReturn *this;
  ExprBase *coroutineStateUpdate;
  SynBase *source_00;
  ExprBase *closures;
  TypeBase *local_60;
  ExprBase *local_58;
  ExprBase *curr;
  ExprBase *local_40;
  ExprBase *result;
  TypeBase *actual;
  TypeBase *expected;
  IntrusiveList<ExprBase> *expressions_local;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (((function->hasExplicitReturn & 1U) == 0) &&
     (pTVar1 = function->type->returnType, pTVar1 != ctx->typeVoid)) {
    if (expressions->tail == (ExprBase *)0x0) {
      local_60 = ctx->typeVoid;
    }
    else {
      local_60 = expressions->tail->type;
    }
    if ((local_60 != ctx->typeVoid) && (bVar2 = isType<TypeError>(local_60), !bVar2)) {
      local_40 = expressions->tail;
      if (pTVar1 == ctx->typeAuto) {
        if ((local_40 != (ExprBase *)0x0) &&
           (bVar2 = AssertValueExpression(ctx,local_40->source,local_40), !bVar2)) {
          return;
        }
        pTVar3 = ExpressionContext::GetFunctionType(ctx,source,local_60,function->type->arguments);
        function->type = pTVar3;
      }
      else {
        local_40 = CreateCast(ctx,source,expressions->tail,pTVar1,false);
      }
      this = ExpressionContext::get<ExprReturn>(ctx);
      pTVar1 = ctx->typeVoid;
      coroutineStateUpdate = CreateFunctionCoroutineStateUpdate(ctx,source,function,0);
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      closures = CreateFunctionUpvalueClose(ctx,source_00,function,ctx->scope);
      ExprReturn::ExprReturn(this,source,pTVar1,local_40,coroutineStateUpdate,closures);
      if (expressions->head == expressions->tail) {
        expressions->tail = &this->super_ExprBase;
        expressions->head = &this->super_ExprBase;
      }
      else {
        for (local_58 = expressions->head; local_58 != (ExprBase *)0x0; local_58 = local_58->next) {
          if (local_58->next == expressions->tail) {
            local_58->next = &this->super_ExprBase;
          }
        }
      }
      function->hasExplicitReturn = true;
    }
  }
  return;
}

Assistant:

void DeduceShortFunctionReturnValue(ExpressionContext &ctx, SynBase *source, FunctionData *function, IntrusiveList<ExprBase> &expressions)
{
	if(function->hasExplicitReturn)
		return;

	TypeBase *expected = function->type->returnType;

	if(expected == ctx.typeVoid)
		return;

	TypeBase *actual = expressions.tail ? expressions.tail->type : ctx.typeVoid;

	if(actual == ctx.typeVoid)
		return;

	if(isType<TypeError>(actual))
		return;

	ExprBase *result = expressions.tail;

	// If return type is auto, set it to type that is being returned
	if(expected == ctx.typeAuto)
	{
		if(result && !AssertValueExpression(ctx, result->source, result))
			return;

		function->type = ctx.GetFunctionType(source, actual, function->type->arguments);
	}
	else
	{
		result = CreateCast(ctx, source, expressions.tail, expected, false);
	}

	result = new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));

	if(expressions.head == expressions.tail)
	{
		expressions.head = expressions.tail = result;
	}
	else
	{
		ExprBase *curr = expressions.head;

		while(curr)
		{
			if(curr->next == expressions.tail)
				curr->next = result;

			curr = curr->next;
		}
	}

	function->hasExplicitReturn = true;
}